

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_storage.cpp
# Opt level: O3

void __thiscall libtorrent::aux::posix_storage::posix_storage(posix_storage *this,storage_params *p)

{
  string *psVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  file_storage *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  file_storage *pfVar6;
  size_type *psVar7;
  pointer __p;
  span<const_char> in;
  _Head_base<0UL,_libtorrent::file_storage_*,_false> local_78;
  long local_70;
  undefined1 local_68 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this->m_files = p->files;
  (this->m_mapped_files)._M_t.
  super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>.
  _M_t.
  super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
  .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl = (file_storage *)0x0;
  psVar1 = p->path;
  paVar5 = &(this->m_save_path).field_2;
  (this->m_save_path)._M_dataplus._M_p = (pointer)paVar5;
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_save_path,pcVar2,pcVar2 + psVar1->_M_string_length);
  local_68._16_8_ = &this->m_save_path;
  stat_cache::stat_cache(&this->m_stat_cache);
  ::std::
  vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  ::vector(&(this->m_file_priority).
            super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
           ,&p->priorities->
             super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          );
  (this->m_use_partfile).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->m_use_partfile).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (this->m_use_partfile).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->m_use_partfile).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->m_use_partfile).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  in.m_len = (difference_type)paVar5;
  in.m_ptr = (char *)0x14;
  to_hex_abi_cxx11_((string *)(local_68 + 0x18),(aux *)&p->info_hash,in);
  plVar4 = (long *)::std::__cxx11::string::replace((ulong)(local_68 + 0x18),0,(char *)0x0,0x3d5c63);
  pfVar6 = (file_storage *)(plVar4 + 2);
  if ((file_storage *)*plVar4 == pfVar6) {
    local_68._0_4_ = pfVar6->m_piece_length;
    local_68._4_4_ = pfVar6->m_num_pieces;
    local_68._8_8_ = plVar4[3];
    local_78._M_head_impl = (file_storage *)local_68;
  }
  else {
    local_68._0_4_ = pfVar6->m_piece_length;
    local_68._4_4_ = pfVar6->m_num_pieces;
    local_78._M_head_impl = (file_storage *)*plVar4;
  }
  local_70 = plVar4[1];
  *plVar4 = (long)pfVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_78);
  paVar5 = &(this->m_part_file_name).field_2;
  (this->m_part_file_name)._M_dataplus._M_p = (pointer)paVar5;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar7) {
    lVar3 = plVar4[3];
    paVar5->_M_allocated_capacity = *psVar7;
    *(long *)((long)&(this->m_part_file_name).field_2 + 8) = lVar3;
  }
  else {
    (this->m_part_file_name)._M_dataplus._M_p = (pointer)*plVar4;
    (this->m_part_file_name).field_2._M_allocated_capacity = *psVar7;
  }
  (this->m_part_file_name)._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_78._M_head_impl != (file_storage *)local_68) {
    operator_delete(local_78._M_head_impl,local_68._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._24_8_ != &local_40) {
    operator_delete((void *)local_68._24_8_,local_40._M_allocated_capacity + 1);
  }
  (this->m_part_file)._M_t.
  super___uniq_ptr_impl<libtorrent::aux::posix_part_file,_std::default_delete<libtorrent::aux::posix_part_file>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::posix_part_file_*,_std::default_delete<libtorrent::aux::posix_part_file>_>
  .super__Head_base<0UL,_libtorrent::aux::posix_part_file_*,_false>._M_head_impl =
       (posix_part_file *)0x0;
  pfVar6 = p->mapped_files;
  if (pfVar6 != (file_storage *)0x0) {
    this_00 = (file_storage *)operator_new(0xb8);
    file_storage::file_storage(this_00,pfVar6);
    local_78._M_head_impl = (file_storage *)0x0;
    ::std::__uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
    ::reset((__uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
             *)&this->m_mapped_files,this_00);
    ::std::unique_ptr<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>::
    ~unique_ptr((unique_ptr<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
                 *)&local_78);
  }
  return;
}

Assistant:

posix_storage::posix_storage(storage_params const& p)
		: m_files(p.files)
		, m_save_path(p.path)
		, m_file_priority(p.priorities)
		, m_part_file_name("." + to_hex(p.info_hash) + ".parts")
	{
		if (p.mapped_files) m_mapped_files = std::make_unique<file_storage>(*p.mapped_files);
	}